

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::M_formatter<spdlog::details::null_scoped_padder>::format
          (M_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  size_t sVar2;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  ulong local_58 [3];
  buffer<char> local_40;
  memory_buf_t *local_20;
  
  uVar1 = tm_time->tm_min;
  local_58[0] = (ulong)uVar1;
  if (local_58[0] < 100) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = (byte)(local_58[0] / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
  }
  else {
    local_40.size_ = (dest->super_buffer<char>).size_;
    local_40._vptr_buffer = (_func_int **)&PTR_grow_004572d0;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_58;
    args.desc_ = 1;
    local_40.capacity_ = local_40.size_;
    local_20 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_40,fmt,args,(locale_ref)0x0);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_min, dest);
    }